

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  float *pfVar2;
  Vector<float,_2> *pVVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_3> *pVVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  Vector<float,_3> *pVVar10;
  int col;
  bool bVar11;
  undefined4 uVar12;
  Matrix<float,_2,_3> res;
  float afStack_4c [5];
  Type in0;
  Vec4 *local_18;
  int local_10 [4];
  
  pfVar2 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar8) = uVar12;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 == 0xc);
      lVar7 = lVar7 + 1;
      pfVar2 = pfVar2 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data[0] = (float)uVar1;
    in0.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    in0.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    puVar5 = &s_constInMat2x3;
    lVar4 = 0;
    do {
      lVar7 = 0;
      pfVar9 = pfVar2;
      do {
        *pfVar9 = (float)puVar5[lVar7];
        lVar7 = lVar7 + 1;
        pfVar9 = pfVar9 + 3;
      } while (lVar7 == 1);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 2;
    } while (lVar4 != 3);
  }
  pfVar2 = (float *)&res;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      uVar12 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar12 = 0;
      }
      pfVar2[lVar7 * 2] = (float)uVar12;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pfVar2 = pfVar2 + 1;
    bVar11 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar11);
  pVVar3 = (Vector<float,_2> *)&res;
  pVVar6 = (Vector<float,_3> *)&in0;
  lVar4 = 0;
  do {
    lVar7 = 0;
    pVVar10 = pVVar6;
    do {
      ((Vector<tcu::Vector<float,_2>,_3> *)pVVar3->m_data)->m_data[0].m_data[lVar7] =
           ((Vector<tcu::Vector<float,_3>,_2> *)pVVar10->m_data)->m_data[0].m_data[0];
      lVar7 = lVar7 + 1;
      pVVar10 = pVVar10 + 1;
    } while (lVar7 == 1);
    lVar4 = lVar4 + 1;
    pVVar3 = pVVar3 + 1;
    pVVar6 = (Vector<float,_3> *)(pVVar6->m_data + 1);
  } while (lVar4 != 3);
  afStack_4c[2] = res.m_data.m_data[0].m_data[0] + res.m_data.m_data[0].m_data[1];
  afStack_4c[3] = res.m_data.m_data[1].m_data[0] + res.m_data.m_data[1].m_data[1];
  afStack_4c[4] = res.m_data.m_data[2].m_data[0] + res.m_data.m_data[2].m_data[1];
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_10[2] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar4 * 4)] = afStack_4c[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}